

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O3

knote * knote_index_RB_NEXT(knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  bool bVar3;
  
  pkVar1 = (elm->kn_index).rbe_right;
  if (pkVar1 == (knote *)0x0) {
    pkVar2 = (elm->kn_index).rbe_parent;
    if ((pkVar2 == (knote *)0x0) || ((pkVar2->kn_index).rbe_left != elm)) {
      do {
        pkVar2 = (elm->kn_index).rbe_parent;
        if (pkVar2 == (knote *)0x0) {
          return (knote *)0x0;
        }
        bVar3 = elm == (pkVar2->kn_index).rbe_right;
        elm = pkVar2;
      } while (bVar3);
    }
  }
  else {
    do {
      pkVar2 = pkVar1;
      pkVar1 = (pkVar2->kn_index).rbe_left;
    } while (pkVar1 != (knote *)0x0);
  }
  return pkVar2;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}